

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5IntegrityMethod(sqlite3_vtab *pVtab,char *zSchema,char *zTabname,int isQuick,char **pzErr)

{
  int rc;
  char *pcVar1;
  
  pVtab[1].pModule[1].xOpen = (_func_int_sqlite3_vtab_ptr_sqlite3_vtab_cursor_ptr_ptr *)pzErr;
  rc = sqlite3Fts5StorageIntegrity((Fts5Storage *)pVtab[1].zErrMsg,0);
  if (rc != 0 && *pzErr == (char *)0x0) {
    if ((char)rc == '\v') {
      pcVar1 = sqlite3_mprintf("malformed inverted index for FTS5 table %s.%s",zSchema,zTabname);
      *pzErr = pcVar1;
      rc = 7;
      if (pcVar1 != (char *)0x0) {
        rc = 0;
      }
    }
    else {
      pcVar1 = sqlite3ErrStr(rc);
      pcVar1 = sqlite3_mprintf("unable to validate the inverted index for FTS5 table %s.%s: %s",
                               zSchema,zTabname,pcVar1);
      *pzErr = pcVar1;
    }
  }
  sqlite3Fts5IndexCloseReader(*(Fts5Index **)&pVtab[1].nRef);
  pVtab[1].pModule[1].xOpen = (_func_int_sqlite3_vtab_ptr_sqlite3_vtab_cursor_ptr_ptr *)0x0;
  return rc;
}

Assistant:

static int fts5IntegrityMethod(
  sqlite3_vtab *pVtab,    /* the FTS5 virtual table to check */
  const char *zSchema,    /* Name of schema in which this table lives */
  const char *zTabname,   /* Name of the table itself */
  int isQuick,            /* True if this is a quick-check */
  char **pzErr            /* Write error message here */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  int rc;

  assert( pzErr!=0 && *pzErr==0 );
  UNUSED_PARAM(isQuick);
  assert( pTab->p.pConfig->pzErrmsg==0 );
  pTab->p.pConfig->pzErrmsg = pzErr;
  rc = sqlite3Fts5StorageIntegrity(pTab->pStorage, 0);
  if( *pzErr==0 && rc!=SQLITE_OK ){
    if( (rc&0xff)==SQLITE_CORRUPT ){
      *pzErr = sqlite3_mprintf("malformed inverted index for FTS5 table %s.%s",
          zSchema, zTabname);
      rc = (*pzErr) ? SQLITE_OK : SQLITE_NOMEM;
    }else{
      *pzErr = sqlite3_mprintf("unable to validate the inverted index for"
          " FTS5 table %s.%s: %s",
          zSchema, zTabname, sqlite3_errstr(rc));
    }
  }

  sqlite3Fts5IndexCloseReader(pTab->p.pIndex);
  pTab->p.pConfig->pzErrmsg = 0;

  return rc;
}